

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar_LibSetup(Dar_Lib_t *p,Vec_Int_t *vOuts,Vec_Int_t *vPrios)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  Dar_LibObj_t *pDVar5;
  int local_4c;
  int local_48;
  int Counter;
  int k;
  int i;
  int Out;
  int Class;
  int uTruth;
  int nNodesTotal;
  Dar_LibObj_t *pObj;
  int fTraining;
  Vec_Int_t *vPrios_local;
  Vec_Int_t *vOuts_local;
  Dar_Lib_t *p_local;
  
  if (p->iObj != p->nObjs) {
    __assert_fail("p->iObj == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x121,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  for (Counter = 0; Counter < 0xde; Counter = Counter + 1) {
    p->nNodes[Counter] = 0;
    p->nSubgr[Counter] = 0;
  }
  for (Counter = 0; iVar1 = Vec_IntSize(vOuts), Counter < iVar1; Counter = Counter + 1) {
    iVar1 = Vec_IntEntry(vOuts,Counter);
    pDVar5 = Dar_LibObj(p,iVar1);
    iVar1 = Dar_LibObjTruth(pDVar5);
    p->nSubgr[(int)(uint)p->pMap[iVar1]] = p->nSubgr[(int)(uint)p->pMap[iVar1]] + 1;
  }
  iVar1 = Vec_IntSize(vOuts);
  piVar4 = (int *)malloc((long)iVar1 << 2);
  p->pSubgrMem = piVar4;
  iVar1 = Vec_IntSize(vOuts);
  piVar4 = (int *)malloc((long)iVar1 << 2);
  p->pSubgr0Mem = piVar4;
  p->nSubgrTotal = 0;
  for (Counter = 0; Counter < 0xde; Counter = Counter + 1) {
    p->pSubgr[Counter] = p->pSubgrMem + p->nSubgrTotal;
    p->pSubgr0[Counter] = p->pSubgr0Mem + p->nSubgrTotal;
    p->nSubgrTotal = p->nSubgr[Counter] + p->nSubgrTotal;
    p->nSubgr[Counter] = 0;
  }
  iVar1 = p->nSubgrTotal;
  iVar2 = Vec_IntSize(vOuts);
  if (iVar1 != iVar2) {
    __assert_fail("p->nSubgrTotal == Vec_IntSize(vOuts)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x138,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  for (Counter = 0; iVar1 = Vec_IntSize(vOuts), Counter < iVar1; Counter = Counter + 1) {
    iVar2 = Vec_IntEntry(vOuts,Counter);
    pDVar5 = Dar_LibObj(p,iVar2);
    iVar1 = Dar_LibObjTruth(pDVar5);
    uVar3 = (uint)p->pMap[iVar1];
    piVar4 = p->pSubgr[(int)uVar3];
    iVar1 = p->nSubgr[(int)uVar3];
    p->nSubgr[(int)uVar3] = iVar1 + 1;
    piVar4[iVar1] = iVar2;
  }
  local_4c = 0;
  iVar1 = Vec_IntSize(vOuts);
  piVar4 = (int *)malloc((long)iVar1 << 2);
  p->pPriosMem = piVar4;
  p->nSubgrTotal = 0;
  for (Counter = 0; Counter < 0xde; Counter = Counter + 1) {
    p->pPrios[Counter] = p->pPriosMem + p->nSubgrTotal;
    p->nSubgrTotal = p->nSubgr[Counter] + p->nSubgrTotal;
    for (local_48 = 0; local_48 < p->nSubgr[Counter]; local_48 = local_48 + 1) {
      iVar1 = Vec_IntEntry(vPrios,local_4c);
      p->pPrios[Counter][local_48] = iVar1;
      local_4c = local_4c + 1;
    }
  }
  iVar1 = p->nSubgrTotal;
  iVar2 = Vec_IntSize(vOuts);
  if (iVar1 != iVar2) {
    __assert_fail("p->nSubgrTotal == Vec_IntSize(vOuts)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x179,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar1 = Vec_IntSize(vPrios);
  if (local_4c != iVar1) {
    __assert_fail("Counter == Vec_IntSize(vPrios)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x17a,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  for (Counter = 0; Counter < p->iObj; Counter = Counter + 1) {
    pDVar5 = Dar_LibObj(p,Counter);
    *pDVar5 = (Dar_LibObj_t)((ulong)*pDVar5 & 0xfffffffff | 0xff000000000);
  }
  for (Counter = 0; Counter < 0xde; Counter = Counter + 1) {
    for (local_48 = 0; local_48 < p->nSubgr[Counter]; local_48 = local_48 + 1) {
      pDVar5 = Dar_LibObj(p,p->pSubgr[Counter][local_48]);
      Dar_LibSetup_rec(p,pDVar5,Counter,0);
    }
  }
  p->nNodesTotal = 0;
  for (Counter = 0; Counter < 0xde; Counter = Counter + 1) {
    p->nNodesTotal = p->nNodes[Counter] + p->nNodesTotal;
  }
  piVar4 = (int *)malloc((long)p->nNodesTotal << 2);
  p->pNodesMem = piVar4;
  piVar4 = (int *)malloc((long)p->nNodesTotal << 2);
  p->pNodes0Mem = piVar4;
  p->nNodesTotal = 0;
  for (Counter = 0; Counter < 0xde; Counter = Counter + 1) {
    p->pNodes[Counter] = p->pNodesMem + p->nNodesTotal;
    p->pNodes0[Counter] = p->pNodes0Mem + p->nNodesTotal;
    p->nNodesTotal = p->nNodes[Counter] + p->nNodesTotal;
    p->nNodes[Counter] = 0;
  }
  for (Counter = 0; Counter < p->iObj; Counter = Counter + 1) {
    pDVar5 = Dar_LibObj(p,Counter);
    *pDVar5 = (Dar_LibObj_t)((ulong)*pDVar5 & 0xfffffffff | 0xff000000000);
  }
  Class = 0;
  for (Counter = 0; Counter < 0xde; Counter = Counter + 1) {
    for (local_48 = 0; local_48 < p->nSubgr[Counter]; local_48 = local_48 + 1) {
      pDVar5 = Dar_LibObj(p,p->pSubgr[Counter][local_48]);
      Dar_LibSetup_rec(p,pDVar5,Counter,1);
    }
    Class = p->nNodes[Counter] + Class;
  }
  if (Class != p->nNodesTotal) {
    __assert_fail("nNodesTotal == p->nNodesTotal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x19f,"void Dar_LibSetup(Dar_Lib_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  for (Counter = 0; Counter < 4; Counter = Counter + 1) {
    pDVar5 = Dar_LibObj(p,Counter);
    *pDVar5 = (Dar_LibObj_t)((ulong)*pDVar5 & 0xfffffffff | (ulong)(uint)Counter << 0x24);
  }
  return;
}

Assistant:

void Dar_LibSetup( Dar_Lib_t * p, Vec_Int_t * vOuts, Vec_Int_t * vPrios )
{
    int fTraining = 0;
    Dar_LibObj_t * pObj;
    int nNodesTotal, uTruth, Class, Out, i, k;
    assert( p->iObj == p->nObjs );

    // count the number of representatives of each class
    for ( i = 0; i < 222; i++ )
        p->nSubgr[i] = p->nNodes[i] = 0;
    Vec_IntForEachEntry( vOuts, Out, i )
    {
        pObj = Dar_LibObj( p, Out );
        uTruth = Dar_LibObjTruth( pObj );
        Class = p->pMap[uTruth];
        p->nSubgr[Class]++;
    }
    // allocate memory for the roots of each class
    p->pSubgrMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
    p->pSubgr0Mem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
    p->nSubgrTotal = 0;
    for ( i = 0; i < 222; i++ )
    {
        p->pSubgr[i] = p->pSubgrMem + p->nSubgrTotal;
        p->pSubgr0[i] = p->pSubgr0Mem + p->nSubgrTotal;
        p->nSubgrTotal += p->nSubgr[i];
        p->nSubgr[i] = 0;
    }
    assert( p->nSubgrTotal == Vec_IntSize(vOuts) );
    // add the outputs to storage
    Vec_IntForEachEntry( vOuts, Out, i )
    {
        pObj = Dar_LibObj( p, Out );
        uTruth = Dar_LibObjTruth( pObj );
        Class = p->pMap[uTruth];
        p->pSubgr[Class][ p->nSubgr[Class]++ ] = Out;
    }

    if ( fTraining )
    {
        // allocate memory for the priority of roots of each class
        p->pPriosMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pPrios[i] = p->pPriosMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pPrios[i][k] = k;

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );

        // allocate memory for the priority of roots of each class
        p->pPlaceMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pPlace[i] = p->pPlaceMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pPlace[i][k] = k;

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );

        // allocate memory for the priority of roots of each class
        p->pScoreMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pScore[i] = p->pScoreMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pScore[i][k] = 0;

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );
    }
    else
    {
        int Counter = 0;
        // allocate memory for the priority of roots of each class
        p->pPriosMem = ABC_ALLOC( int, Vec_IntSize(vOuts) );
        p->nSubgrTotal = 0;
        for ( i = 0; i < 222; i++ )
        {
            p->pPrios[i] = p->pPriosMem + p->nSubgrTotal;
            p->nSubgrTotal += p->nSubgr[i];
            for ( k = 0; k < p->nSubgr[i]; k++ )
                p->pPrios[i][k] = Vec_IntEntry(vPrios, Counter++);

        }
        assert( p->nSubgrTotal == Vec_IntSize(vOuts) );
        assert( Counter == Vec_IntSize(vPrios) );
    }

    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // count nodes in each class
    for ( i = 0; i < 222; i++ )
        for ( k = 0; k < p->nSubgr[i]; k++ )
            Dar_LibSetup_rec( p, Dar_LibObj(p, p->pSubgr[i][k]), i, 0 );
    // count the total number of nodes
    p->nNodesTotal = 0;
    for ( i = 0; i < 222; i++ )
        p->nNodesTotal += p->nNodes[i];
    // allocate memory for the nodes of each class
    p->pNodesMem = ABC_ALLOC( int, p->nNodesTotal );
    p->pNodes0Mem = ABC_ALLOC( int, p->nNodesTotal );
    p->nNodesTotal = 0;
    for ( i = 0; i < 222; i++ )
    {
        p->pNodes[i] = p->pNodesMem + p->nNodesTotal;
        p->pNodes0[i] = p->pNodes0Mem + p->nNodesTotal;
        p->nNodesTotal += p->nNodes[i];
        p->nNodes[i] = 0;
    }
    // create traversal IDs
    for ( i = 0; i < p->iObj; i++ )
        Dar_LibObj(p, i)->Num = 0xff;
    // add the nodes to storage
    nNodesTotal = 0;
    for ( i = 0; i < 222; i++ )
    {
         for ( k = 0; k < p->nSubgr[i]; k++ )
            Dar_LibSetup_rec( p, Dar_LibObj(p, p->pSubgr[i][k]), i, 1 );
         nNodesTotal += p->nNodes[i];
//printf( "Class %3d : Subgraphs = %4d. Nodes = %5d.\n", i, p->nSubgr[i], p->nNodes[i] );
    }
    assert( nNodesTotal == p->nNodesTotal );
     // prepare the number of the PI nodes
    for ( i = 0; i < 4; i++ )
        Dar_LibObj(p, i)->Num = i;
}